

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O2

void license::test::generate_and_verify_license
               (LCC_API_HW_IDENTIFICATION_STRATEGY strategy,string *lic_fname)

{
  unit_test_log_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  uint local_2b00;
  LCC_EVENT_TYPE result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraArgs;
  char *local_2ae0;
  char *local_2ad8;
  char *local_2ad0;
  char *local_2ac8;
  char *local_2ac0;
  char *local_2ab8;
  string licLocation;
  string identifier_out;
  undefined **local_2a70;
  undefined1 local_2a68;
  undefined1 *local_2a60;
  char *local_2a58;
  char *local_2a50;
  char *local_2a48;
  undefined1 *local_2a40;
  undefined1 *local_2a38;
  char *local_2a30;
  char *local_2a28;
  char *local_2a20;
  char *local_2a18;
  undefined1 *local_2a10;
  undefined1 *local_2a08;
  char *local_2a00;
  char *local_29f8;
  char *local_29f0;
  char *local_29e8;
  undefined1 *local_29e0;
  undefined1 *local_29d8;
  char *local_29d0;
  char *local_29c8;
  pointer local_29c0;
  pointer local_29b8;
  pointer local_29b0;
  pointer local_29a8;
  pointer local_29a0;
  pointer local_2998;
  LicenseInfo license;
  LicenseLocation location;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2ab8 = "";
  memset(&license,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  std::operator<<((ostream *)&license,"Before generate");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                     ((basic_wrap_stringstream<char> *)&license);
  local_29a0 = (pbVar2->_M_dataplus)._M_p;
  local_2998 = local_29a0 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2ac0,0x20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
            (&identifier_out,(HwIdentifierFacade *)(ulong)(uint)strategy,strategy_00);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2ad0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2ac8 = "";
  memset(&license,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  std::operator<<((ostream *)&license,"After generate signature");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                     ((basic_wrap_stringstream<char> *)&license);
  local_29b0 = (pbVar2->_M_dataplus)._M_p;
  local_29a8 = local_29b0 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2ad0,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  poVar3 = std::operator<<((ostream *)std::cout,"Identifier:");
  poVar3 = std::operator<<(poVar3,(string *)&identifier_out);
  std::endl<char,std::char_traits<char>>(poVar3);
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&license,"-s",(allocator *)&location);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extraArgs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&license);
  std::__cxx11::string::~string((string *)&license);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&extraArgs,&identifier_out);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2ae0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2ad8 = "";
  memset(&license,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  std::operator<<((ostream *)&license,"Before generate license");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                     ((basic_wrap_stringstream<char> *)&license);
  local_29c0 = (pbVar2->_M_dataplus)._M_p;
  local_29b8 = local_29c0 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2ae0,0x27);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  generate_license(&licLocation,lic_fname,&extraArgs);
  memset(&location,0,0x1004);
  if (licLocation._M_string_length != 0) {
    memmove(location.licenseData,licLocation._M_dataplus._M_p,licLocation._M_string_length);
  }
  result = acquire_license((CallerInformations *)0x0,&location,&license);
  local_29d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_29c8 = "";
  local_29e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_29d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_29d0,0x2d);
  local_2a68 = 0;
  local_2a70 = &PTR__lazy_ostream_0056b5f0;
  local_2a60 = boost::unit_test::lazy_ostream::inst;
  local_2a58 = "";
  local_29f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_29e8 = "";
  local_2b00 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
            (&local_2a70,&local_29f0,0x2d,1,2,&result,"result",&local_2b00,"LICENSE_OK");
  local_2a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_29f8 = "";
  local_2a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a08 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a00,0x2e);
  local_2a68 = 0;
  local_2a70 = &PTR__lazy_ostream_0056b5f0;
  local_2a60 = boost::unit_test::lazy_ostream::inst;
  local_2a58 = "";
  local_2a20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a18 = "";
  local_2b00 = local_2b00 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_2a70,&local_2a20,0x2e,1,2,&license.has_expiry,"license.has_expiry",&local_2b00,
             "false");
  local_2a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a28 = "";
  local_2a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a30,0x2f);
  local_2a68 = 0;
  local_2a70 = &PTR__lazy_ostream_0056b5f0;
  local_2a60 = boost::unit_test::lazy_ostream::inst;
  local_2a58 = "";
  local_2a50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a48 = "";
  local_2b00 = CONCAT31(local_2b00._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_2a70,&local_2a50,0x2f,1,2,&license.linked_to_pc,"license.linked_to_pc",
             &local_2b00,"true");
  std::__cxx11::string::~string((string *)&licLocation);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extraArgs);
  std::__cxx11::string::~string((string *)&identifier_out);
  return;
}

Assistant:

static void generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY strategy, const string& lic_fname) {
	BOOST_TEST_CHECKPOINT("Before generate");
	const string identifier_out = HwIdentifierFacade::generate_user_pc_signature(strategy);
	BOOST_TEST_CHECKPOINT("After generate signature");
	cout << "Identifier:" << identifier_out << endl;
	vector<string> extraArgs;
	extraArgs.push_back("-s");
	extraArgs.push_back(identifier_out);
	BOOST_TEST_CHECKPOINT("Before generate license");
	const string licLocation = generate_license(lic_fname, extraArgs);
	LicenseInfo license;
	LicenseLocation location = {LICENSE_PATH};
	std::copy(licLocation.begin(), licLocation.end(), location.licenseData);
	const LCC_EVENT_TYPE result = acquire_license(nullptr, &location, &license);
	BOOST_CHECK_EQUAL(result, LICENSE_OK);
	BOOST_CHECK_EQUAL(license.has_expiry, false);
	BOOST_CHECK_EQUAL(license.linked_to_pc, true);
}